

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void printXMLCrossRefEqConsole(TidyDoc tdoc,TidyOption topt)

{
  char *__s2;
  int iVar1;
  ctmbstr ptVar2;
  size_t __n;
  tmbstr ptVar3;
  tmbstr localName;
  char buffer [50];
  undefined1 local_58 [8];
  CmdOptDesc localHit;
  CmdOptDesc *hit;
  CmdOptDesc *pos;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  localHit.name3 = (ctmbstr)0x0;
  hit = cmdopt_defs;
  do {
    if (hit->name1 == (ctmbstr)0x0) {
LAB_00135050:
      if (localHit.name3 == (ctmbstr)0x0) {
        printf("  %s\n","  <eqconsole />");
      }
      else {
        memcpy(local_58,localHit.name3,0x30);
        localize_option_names((CmdOptDesc *)local_58);
        ptVar3 = get_escaped_name((ctmbstr)localHit._0_8_);
        printf("  <eqconsole>%s</eqconsole>\n");
        free((void *)localHit._0_8_);
        free(ptVar3);
        if (localHit.eqconfig != (ctmbstr)0x0) {
          ptVar3 = get_escaped_name(localHit.eqconfig);
          printf("  <eqconsole>%s</eqconsole>\n");
          free(localHit.eqconfig);
          free(ptVar3);
        }
        if (localHit.name2 != (ctmbstr)0x0) {
          ptVar3 = get_escaped_name(localHit.name2);
          printf("  <eqconsole>%s</eqconsole>\n");
          free(localHit.name2);
          free(ptVar3);
        }
        if (localHit._16_8_ != 0) {
          free((void *)localHit._16_8_);
        }
      }
      return;
    }
    ptVar2 = tidyOptGetName(topt);
    snprintf((char *)&localName,0x32,"%s:",ptVar2);
    if (hit->eqconfig != (ctmbstr)0x0) {
      __s2 = hit->eqconfig;
      __n = strlen((char *)&localName);
      iVar1 = strncmp((char *)&localName,__s2,__n);
      if (iVar1 == 0) {
        localHit.name3 = (ctmbstr)hit;
        goto LAB_00135050;
      }
    }
    hit = hit + 1;
  } while( true );
}

Assistant:

static void printXMLCrossRefEqConsole(TidyDoc tdoc,   /**< The Tidy document. */
                                      TidyOption topt /**< The option. */
                                      )
{
    const CmdOptDesc* pos = cmdopt_defs;
    const CmdOptDesc* hit = NULL;
    CmdOptDesc localHit;
    enum { sizeBuffer = 50 }; /* largest config name is 27 chars so far... */
    char buffer[sizeBuffer];

    for( pos=cmdopt_defs; pos->name1; ++pos)
    {
        snprintf(buffer, sizeBuffer, "%s:", tidyOptGetName( topt ));
        if ( pos->eqconfig && (strncmp(buffer, pos->eqconfig, strlen(buffer)) == 0) )
        {
            hit = pos;
            break;
        }
    }

    if ( hit )
    {
        tmbstr localName;
        localHit = *hit;
        localize_option_names( &localHit );
        printf("  <eqconsole>%s</eqconsole>\n", localName = get_escaped_name(localHit.name1));
        free((tmbstr)localHit.name1);
        free(localName);
        if ( localHit.name2 )
        {
            printf("  <eqconsole>%s</eqconsole>\n", localName = get_escaped_name(localHit.name2));
            free((tmbstr)localHit.name2);
            free(localName);
        }
        if ( localHit.name3 )
        {
            printf("  <eqconsole>%s</eqconsole>\n", localName = get_escaped_name(localHit.name3));
            free((tmbstr)localHit.name3);
            free(localName);
        }
        if ( localHit.eqconfig ) /* Is. #791 */
        {
            free((tmbstr)localHit.eqconfig);
        }

    }
    else
        printf("  %s\n", "  <eqconsole />");
}